

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall kratos::Simulator::set_i(Simulator *this,Var *var,optional<long> value,bool eval_)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  optional<unsigned_long> op_value;
  
  if (((undefined1  [16])
       value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar1 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
    iVar2 = truncate((char *)value.super__Optional_base<long,_true,_true>._M_payload.
                             super__Optional_payload_base<long>._M_payload,(ulong)uVar1);
    op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._4_4_ = extraout_var;
    op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ = iVar2;
    op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._8_8_ = 1;
    set_value_(this,var,op_value);
    if (eval_) {
      eval(this);
      return;
    }
  }
  return;
}

Assistant:

void Simulator::set_i(const kratos::Var *var, std::optional<int64_t> value, bool eval_) {
    if (value) {
        auto v = *value;
        auto u_v = *(reinterpret_cast<uint64_t *>(&v));
        u_v = truncate(u_v, var->width());
        set_value_(var, u_v);
        if (eval_) eval();
    }
}